

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_call_function(Nvim *this,string *fn,Array *args)

{
  allocator local_41;
  string local_40;
  Array *local_20;
  Array *args_local;
  string *fn_local;
  Nvim *this_local;
  
  local_20 = args;
  args_local = (Array *)fn;
  fn_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_call_function",&local_41);
  NvimRPC::
  async_call<std::__cxx11::string,std::vector<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::allocator<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>
            (&this->client_,&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local,
             local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void Nvim::async_call_function(const std::string& fn, const Array& args) {
    client_.async_call("nvim_call_function", fn, args);
}